

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tsgIOHelpers.hpp
# Opt level: O1

void TasGrid::IO::writeNumbers<true,(TasGrid::IO::IOPad)4,unsigned_long,unsigned_long>
               (ostream *os,unsigned_long vals,unsigned_long vals_1)

{
  initializer_list<unsigned_long> __l;
  vector<unsigned_long,_std::allocator<unsigned_long>_> values;
  allocator_type local_39;
  vector<unsigned_long,_std::allocator<unsigned_long>_> local_38;
  unsigned_long local_20;
  unsigned_long local_18;
  
  __l._M_len = 2;
  __l._M_array = &local_20;
  local_20 = vals;
  local_18 = vals_1;
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector(&local_38,__l,&local_39);
  std::ostream::write((char *)os,
                      (long)local_38.
                            super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                            _M_impl.super__Vector_impl_data._M_start);
  if (local_38.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_38.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)local_38.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_38.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

void writeNumbers(std::ostream &os, Vals... vals){
    std::vector<typename std::tuple_element<0, std::tuple<Vals...>>::type> values = {vals...};
    writeVector<iomode, pad>(values, os);
}